

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::Federate(Federate *this,Federate *fed)

{
  Modes __i;
  TimeRepresentation<count_time<9,_long>_> TVar1;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Modes tmode;
  undefined4 in_stack_ffffffffffffffa8;
  __integral_type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  memory_order __m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__Federate_009c15e0;
  uVar2 = 0;
  __str = in_RDI;
  std::atomic<helics::Federate::Modes>::atomic
            ((atomic<helics::Federate::Modes> *)&in_RDI->_M_string_length,STARTUP);
  *(undefined1 *)((long)&in_RDI->_M_string_length + 1) = 0x2f;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 2) = 1;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 3) = 0;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 4) = 0;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 5) = 0;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 6) = 0;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 7) = 0;
  LocalFederateId::LocalFederateId((LocalFederateId *)&in_RDI->field_2);
  CLI::std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x30ce67);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[1]._M_string_length = TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[1].field_2._M_allocated_capacity = TVar1.internalTimeCode;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>,std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>>
  ::
  unique_ptr<std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>,void>
            ((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
              *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::
  unique_ptr<helics::ConnectorFederateManager,std::default_delete<helics::ConnectorFederateManager>>
  ::unique_ptr<std::default_delete<helics::ConnectorFederateManager>,void>
            ((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::
  unique_ptr<helics::PotentialInterfacesManager,std::default_delete<helics::PotentialInterfacesManager>>
  ::unique_ptr<std::default_delete<helics::PotentialInterfacesManager>,void>
            ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
              *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
              *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::function
            ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::function<void_(bool)>::function
            ((function<void_(bool)> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  CLI::std::function<void_()>::function
            ((function<void_()> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  CLI::std::function<void_()>::function
            ((function<void_()> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  __m = seq_cst;
  __i = CLI::std::atomic<helics::Federate::Modes>::load
                  ((atomic<helics::Federate::Modes> *)(in_RSI + 8),seq_cst);
  std::atomic<helics::Federate::Modes>::store
            ((atomic<helics::Federate::Modes> *)&in_RDI->_M_string_length,__i,__m);
  std::atomic<helics::Federate::Modes>::store
            ((atomic<helics::Federate::Modes> *)(in_RSI + 8),FINALIZE,__m);
  *(undefined4 *)&in_RDI->field_2 = *(undefined4 *)(in_RSI + 0x10);
  std::shared_ptr<helics::Core>::operator=
            ((shared_ptr<helics::Core> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
             (shared_ptr<helics::Core> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  CoreFactory::getEmptyCore();
  std::shared_ptr<helics::Core>::operator=
            ((shared_ptr<helics::Core> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
             (shared_ptr<helics::Core> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  CLI::std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x30cff2);
  in_RDI[1]._M_string_length = *(size_type *)(in_RSI + 0x28);
  *(undefined1 *)((long)&in_RDI->_M_string_length + 1) = *(undefined1 *)(in_RSI + 9);
  *(byte *)((long)&in_RDI->_M_string_length + 2) = *(byte *)(in_RSI + 10) & 1;
  *(byte *)((long)&in_RDI->_M_string_length + 4) = *(byte *)(in_RSI + 0xc) & 1;
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator=((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
              (unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator=((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
              (unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (unaff_retaddr,__str);
  return;
}

Assistant:

Federate::Federate(Federate&& fed) noexcept
{
    auto tmode = fed.currentMode.load();
    currentMode.store(tmode);
    fed.currentMode.store(Modes::FINALIZE);
    fedID = fed.fedID;
    coreObject = std::move(fed.coreObject);
    fed.coreObject = CoreFactory::getEmptyCore();
    mCurrentTime = fed.mCurrentTime;
    nameSegmentSeparator = fed.nameSegmentSeparator;
    strictConfigChecking = fed.strictConfigChecking;
    observerMode = fed.observerMode;
    asyncCallInfo = std::move(fed.asyncCallInfo);
    cManager = std::move(fed.cManager);
    mName = std::move(fed.mName);
}